

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O0

bool __thiscall
QRawFont::glyphIndexesForChars
          (QRawFont *this,QChar *chars,int numChars,quint32 *glyphIndexes,int *numGlyphs)

{
  bool bVar1;
  int iVar2;
  QRawFontPrivate *pQVar3;
  long in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  int *in_R8;
  long in_FS_OFFSET;
  QGlyphLayout glyphs;
  ShaperFlag in_stack_ffffffffffffff6c;
  QFontEngine *this_00;
  bool local_3d;
  undefined4 local_3c;
  QGlyphLayout local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x7915d3);
  bVar1 = QRawFontPrivate::isValid(pQVar3);
  if ((bVar1) && (0 < in_EDX)) {
    if ((*in_R8 < 1) || (in_RCX == 0)) {
      *in_R8 = in_EDX;
      local_3d = false;
    }
    else {
      memset(&local_38,0xaa,0x30);
      QGlyphLayout::QGlyphLayout(&local_38);
      local_38.numGlyphs = *in_R8;
      pQVar3 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x791664);
      this_00 = pQVar3->fontEngine;
      QFlags<QFontEngine::ShaperFlag>::QFlags
                ((QFlags<QFontEngine::ShaperFlag> *)this_00,in_stack_ffffffffffffff6c);
      iVar2 = (**(code **)(*(long *)&this_00->_vptr_QFontEngine + 0x60))
                        (this_00,in_RSI,in_EDX,&local_38,in_R8,local_3c);
      local_3d = -1 < iVar2;
    }
  }
  else {
    *in_R8 = 0;
    local_3d = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3d;
}

Assistant:

bool QRawFont::glyphIndexesForChars(const QChar *chars, int numChars, quint32 *glyphIndexes, int *numGlyphs) const
{
    Q_ASSERT(numGlyphs);
    if (!d->isValid() || numChars <= 0) {
        *numGlyphs = 0;
        return false;
    }

    if (*numGlyphs <= 0 || !glyphIndexes) {
        *numGlyphs = numChars;
        return false;
    }

    QGlyphLayout glyphs;
    glyphs.numGlyphs = *numGlyphs;
    glyphs.glyphs = glyphIndexes;
    return d->fontEngine->stringToCMap(chars, numChars, &glyphs, numGlyphs, QFontEngine::GlyphIndicesOnly) >= 0;
}